

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cc
# Opt level: O0

void __thiscall
raptor::Thread::Thread
          (Thread *this,char *thread_name,ThreadExecutor *thread_proc,void *arg,bool *success,
          Options *options)

{
  ThreadExecutor *name;
  InternalThreadImpl *this_00;
  function<void_(void_*)> local_60;
  bool local_39;
  Options *pOStack_38;
  bool ret;
  Options *options_local;
  bool *success_local;
  void *arg_local;
  ThreadExecutor *thread_proc_local;
  char *thread_name_local;
  Thread *this_local;
  
  local_39 = false;
  pOStack_38 = options;
  options_local = (Options *)success;
  success_local = (bool *)arg;
  arg_local = thread_proc;
  thread_proc_local = (ThreadExecutor *)thread_name;
  thread_name_local = (char *)this;
  this_00 = (InternalThreadImpl *)operator_new(0x70);
  name = thread_proc_local;
  std::function<void_(void_*)>::function(&local_60,thread_proc);
  InternalThreadImpl::InternalThreadImpl
            (this_00,(char *)name,&local_60,success_local,&local_39,pOStack_38);
  this->_impl = (IThreadService *)this_00;
  std::function<void_(void_*)>::~function(&local_60);
  if ((local_39 & 1U) == 0) {
    this->_state = kFailed;
    if (this->_impl != (IThreadService *)0x0) {
      (*this->_impl->_vptr_IThreadService[1])();
    }
    this->_impl = (IThreadService *)0x0;
  }
  else {
    this->_state = kAlive;
  }
  if (options_local != (Options *)0x0) {
    options_local->_joinable = (bool)(local_39 & 1);
  }
  return;
}

Assistant:

Thread::Thread(
    const char* thread_name,
    ThreadExecutor thread_proc, void* arg,
    bool* success, const Options& options) {
    bool ret = false;
    _impl = new InternalThreadImpl(thread_name, thread_proc, arg, &ret, options);
    if (!ret) {
        _state = kFailed;
        delete _impl;
        _impl = nullptr;
    } else {
        _state = kAlive;
    }
    if (success) {
        *success = ret;
    }
}